

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_custom_request
              (LIBSSH2_CHANNEL *channel,int want_reply,char *request_type,uint request_type_len,
              char *data,uint data_len)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  int iVar2;
  time_t start_time;
  uchar *puVar3;
  char *errmsg;
  bool bVar4;
  uchar *data_1;
  int local_74;
  uchar *local_70;
  size_t local_68;
  char *local_60;
  ulong local_58;
  packet_requirev_state_t *local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar1 = -0x27;
  }
  else {
    local_74 = want_reply;
    local_40 = request_type;
    start_time = time((time_t *)0x0);
    local_38 = (ulong)(request_type_len + data_len + 10);
    local_70 = channel->channel_custom_local_channel;
    local_50 = &channel->channel_custom_packet_requirev_state;
    local_58 = (ulong)data_len;
    local_48 = (ulong)request_type_len;
    do {
      session = channel->session;
      if (channel->channel_custom_state == libssh2_NB_state_idle) {
        channel->channel_custom_packet_len = local_38;
        (channel->channel_custom_packet_requirev_state).start = 0;
        if (channel->channel_custom_packet != (uchar *)0x0) {
          (*session->free)(channel->channel_custom_packet,&session->abstract);
        }
        puVar3 = (uchar *)(*session->alloc)(channel->channel_custom_packet_len,&session->abstract);
        channel->channel_custom_packet = puVar3;
        if (puVar3 != (uchar *)0x0) {
          data_1 = puVar3 + 1;
          *puVar3 = 'b';
          _libssh2_store_u32(&data_1,(channel->remote).id);
          _libssh2_store_str(&data_1,local_40,local_48);
          puVar3 = data_1 + 1;
          *data_1 = (uchar)local_74;
          data_1 = puVar3;
          if (data_len != 0) {
            memcpy(puVar3,data,local_58);
          }
          channel->channel_custom_state = libssh2_NB_state_created;
          goto LAB_0010a3b7;
        }
        iVar1 = -6;
        errmsg = "Unable to allocate memory for custom channel request";
LAB_0010a544:
        iVar2 = _libssh2_error(session,iVar1,errmsg);
      }
      else {
LAB_0010a3b7:
        if (channel->channel_custom_state == libssh2_NB_state_created) {
          iVar1 = _libssh2_transport_send
                            (session,channel->channel_custom_packet,
                             channel->channel_custom_packet_len,(uchar *)0x0,0);
          if (iVar1 == 0) {
            _libssh2_htonu32(local_70,(channel->local).id);
            channel->channel_custom_state = libssh2_NB_state_sent;
            goto LAB_0010a426;
          }
          if (iVar1 != -0x25) {
            channel->channel_custom_state = libssh2_NB_state_idle;
            errmsg = "Unable to send custom channel request packet";
            goto LAB_0010a544;
          }
          iVar2 = -0x25;
          _libssh2_error(session,-0x25,"Would block sending custom channel request");
        }
        else {
LAB_0010a426:
          if (channel->channel_custom_state != libssh2_NB_state_sent) {
            iVar1 = -0x16;
            errmsg = "Unable to complete custom channel request";
            goto LAB_0010a544;
          }
          if (local_74 == 0) {
            channel->channel_custom_state = libssh2_NB_state_idle;
            iVar2 = 0;
          }
          else {
            data_1 = (uchar *)0x0;
            local_68 = 0;
            iVar2 = _libssh2_packet_requirev(session,"cd",&data_1,&local_68,1,local_70,4,local_50);
            if (iVar2 != -0x25) {
              if (iVar2 == 0) {
                if (local_68 == 0) {
                  bVar4 = false;
                }
                else {
                  bVar4 = *data_1 == 'c';
                }
                local_60 = data;
                if (data_1 != (uchar *)0x0) {
                  (*session->free)(data_1,&session->abstract);
                }
                channel->channel_custom_state = libssh2_NB_state_idle;
                iVar1 = -0x16;
                iVar2 = 0;
                data = local_60;
                if (bVar4) goto LAB_0010a54c;
              }
              else {
                channel->channel_custom_state = libssh2_NB_state_idle;
                iVar1 = -0xe;
              }
              errmsg = "Failed custom channel request";
              goto LAB_0010a544;
            }
          }
        }
      }
LAB_0010a54c:
      if (iVar2 != -0x25) {
        return iVar2;
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar1 = _libssh2_wait_socket(channel->session,start_time);
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

static int channel_custom_request(LIBSSH2_CHANNEL *channel, int want_reply,
                                  const char *request_type, unsigned int request_type_len,
                                  const char *data, unsigned int data_len) {
    LIBSSH2_SESSION *session = channel->session;
    static const unsigned char reply_codes[3] =
        { SSH_MSG_CHANNEL_SUCCESS, SSH_MSG_CHANNEL_FAILURE, 0 };
    int rc;

    if(channel->channel_custom_state == libssh2_NB_state_idle) {
        /* 10 = packet_type(1) + channel(4) + request_type_len(4) + want_reply(1) */
        channel->channel_custom_packet_len = 10 + request_type_len + data_len;

        /* Zero the whole thing out */
        memset(&channel->channel_custom_packet_requirev_state, 0,
               sizeof(channel->channel_custom_packet_requirev_state));

        /* make sure there isn't previous packet we would leak */
        if(channel->channel_custom_packet) {
            LIBSSH2_FREE(session, channel->channel_custom_packet);
        }

        /* allocate memory for packet */
        channel->channel_custom_packet =
            LIBSSH2_ALLOC(session, channel->channel_custom_packet_len);
        if(!channel->channel_custom_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for custom channel request");
        }

        /* compose packet */
        unsigned char *s = channel->channel_custom_packet;
        *(s++) = SSH_MSG_CHANNEL_REQUEST;
        _libssh2_store_u32(&s, channel->remote.id);
        _libssh2_store_str(&s, request_type, request_type_len);
        *(s++) = want_reply;
        if(data_len > 0) {
            memcpy(s, data, data_len);
        }

        channel->channel_custom_state = libssh2_NB_state_created;
    }

    if(channel->channel_custom_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, channel->channel_custom_packet,
                                     channel->channel_custom_packet_len,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, rc,
                           "Would block sending custom channel request");
            return rc;
        }
        else if(rc) {
            channel->channel_custom_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "Unable to send custom channel request packet");
        }
        _libssh2_htonu32(channel->channel_custom_local_channel, channel->local.id);
        channel->channel_custom_state = libssh2_NB_state_sent;
    }

    if(channel->channel_custom_state == libssh2_NB_state_sent) {
        if(!want_reply) {
            channel->channel_custom_state = libssh2_NB_state_idle;
            return 0;
        }

        unsigned char *data = 0;
        size_t data_len = 0;
        unsigned char code = 0;

        rc = _libssh2_packet_requirev(
            session, reply_codes, &data, &data_len, 1,
            channel->channel_custom_local_channel,
            4, &channel->channel_custom_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            channel->channel_custom_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                  "Failed custom channel request");
        }

        if(data_len >= 1) {
            code = data[0];
        }
        if(data) LIBSSH2_FREE(session, data);
        channel->channel_custom_state = libssh2_NB_state_idle;

        if(code == SSH_MSG_CHANNEL_SUCCESS) return 0;

        return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_REQUEST_DENIED,
                          "Failed custom channel request");
    }

    return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_REQUEST_DENIED,
                          "Unable to complete custom channel request");
}